

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_engine.cpp
# Opt level: O2

adios2_error adios2_put(adios2_engine *engine,adios2_variable *variable,void *data,adios2_mode mode)

{
  undefined4 uVar1;
  signed *psVar2;
  char *pcVar3;
  uchar *puVar4;
  complex *pcVar5;
  double *pdVar6;
  int *piVar7;
  long *plVar8;
  ulong *puVar9;
  short *psVar10;
  ushort *puVar11;
  string *psVar12;
  uint *puVar13;
  longdouble *plVar14;
  float *pfVar15;
  Mode MVar16;
  string dataStr;
  allocator local_89;
  string local_88;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string
            ((string *)&local_48,"for adios2_engine, in call to adios2_put",(allocator *)&local_88);
  adios2::helper::CheckForNullptr<adios2_engine>(engine,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string
            ((string *)&local_68,"for adios2_variable, in call to adios2_put",(allocator *)&local_88
            );
  adios2::helper::CheckForNullptr<adios2_variable>(variable,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  uVar1 = *(undefined4 *)(variable + 0x28);
  std::__cxx11::string::string
            ((string *)&local_88,
             "only adios2_mode_deferred or adios2_mode_sync are valid, in call to adios2_put",
             &local_89);
  anon_unknown.dwarf_24013::adios2_ToMode(mode,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  MVar16 = (Mode)data;
  switch(uVar1) {
  case 1:
    psVar2 = (signed *)
             __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                            &adios2::core::Variable<signed_char>::typeinfo,0);
    adios2::core::Engine::Put<signed_char>((Variable *)engine,psVar2,MVar16);
    break;
  case 2:
    psVar10 = (short *)__dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                                      &adios2::core::Variable<short>::typeinfo,0);
    adios2::core::Engine::Put<short>((Variable *)engine,psVar10,MVar16);
    break;
  case 3:
    piVar7 = (int *)__dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                                   &adios2::core::Variable<int>::typeinfo,0);
    adios2::core::Engine::Put<int>((Variable *)engine,piVar7,MVar16);
    break;
  case 4:
    plVar8 = (long *)__dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                                    &adios2::core::Variable<long>::typeinfo,0);
    adios2::core::Engine::Put<long>((Variable *)engine,plVar8,MVar16);
    break;
  case 5:
    puVar4 = (uchar *)__dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                                     &adios2::core::Variable<unsigned_char>::typeinfo,0);
    adios2::core::Engine::Put<unsigned_char>((Variable *)engine,puVar4,MVar16);
    break;
  case 6:
    puVar11 = (ushort *)
              __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                             &adios2::core::Variable<unsigned_short>::typeinfo,0);
    adios2::core::Engine::Put<unsigned_short>((Variable *)engine,puVar11,MVar16);
    break;
  case 7:
    puVar13 = (uint *)__dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                                     &adios2::core::Variable<unsigned_int>::typeinfo,0);
    adios2::core::Engine::Put<unsigned_int>((Variable *)engine,puVar13,MVar16);
    break;
  case 8:
    puVar9 = (ulong *)__dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                                     &adios2::core::Variable<unsigned_long>::typeinfo,0);
    adios2::core::Engine::Put<unsigned_long>((Variable *)engine,puVar9,MVar16);
    break;
  case 9:
    pfVar15 = (float *)__dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                                      &adios2::core::Variable<float>::typeinfo,0);
    adios2::core::Engine::Put<float>((Variable *)engine,pfVar15,MVar16);
    break;
  case 10:
    pdVar6 = (double *)
             __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                            &adios2::core::Variable<double>::typeinfo,0);
    adios2::core::Engine::Put<double>((Variable *)engine,pdVar6,MVar16);
    break;
  case 0xb:
    plVar14 = (longdouble *)
              __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                             &adios2::core::Variable<long_double>::typeinfo,0);
    adios2::core::Engine::Put<long_double>((Variable *)engine,plVar14,MVar16);
    break;
  case 0xc:
    pcVar5 = (complex *)
             __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                            &adios2::core::Variable<std::complex<float>>::typeinfo,0);
    adios2::core::Engine::Put<std::complex<float>>((Variable *)engine,pcVar5,MVar16);
    break;
  case 0xd:
    pcVar5 = (complex *)
             __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                            &adios2::core::Variable<std::complex<double>>::typeinfo,0);
    adios2::core::Engine::Put<std::complex<double>>((Variable *)engine,pcVar5,MVar16);
    break;
  case 0xe:
    std::__cxx11::string::string((string *)&local_88,(char *)data,&local_89);
    psVar12 = (string *)
              __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                             &adios2::core::Variable<std::__cxx11::string>::typeinfo,0);
    adios2::core::Engine::Put<std::__cxx11::string>((Variable *)engine,psVar12,(Mode)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    break;
  case 0xf:
    pcVar3 = (char *)__dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                                    &adios2::core::Variable<char>::typeinfo,0);
    adios2::core::Engine::Put<char>((Variable *)engine,pcVar3,MVar16);
  }
  return adios2_error_none;
}

Assistant:

adios2_error adios2_put(adios2_engine *engine, adios2_variable *variable, const void *data,
                        const adios2_mode mode)
{
    try
    {
        adios2::helper::CheckForNullptr(engine, "for adios2_engine, in call to adios2_put");

        adios2::core::Engine *engineCpp = reinterpret_cast<adios2::core::Engine *>(engine);

        adios2::helper::CheckForNullptr(variable, "for adios2_variable, in call to adios2_put");

        adios2::core::VariableBase *variableBase =
            reinterpret_cast<adios2::core::VariableBase *>(variable);
        const adios2::DataType type(variableBase->m_Type);

        const adios2::Mode modeCpp =
            adios2_ToMode(mode, "only adios2_mode_deferred or adios2_mode_sync are valid, "
                                "in call to adios2_put");

        if (type == adios2::DataType::Struct)
        {
            // not supported
        }
        else if (type == adios2::helper::GetDataType<std::string>())
        {
            const std::string dataStr(reinterpret_cast<const char *>(data));
            engineCpp->Put(*dynamic_cast<adios2::core::Variable<std::string> *>(variableBase),
                           dataStr, modeCpp);
        }
#define declare_template_instantiation(T)                                                          \
    else if (type == adios2::helper::GetDataType<T>())                                             \
    {                                                                                              \
        engineCpp->Put(*dynamic_cast<adios2::core::Variable<T> *>(variableBase),                   \
                       reinterpret_cast<const T *>(data), modeCpp);                                \
    }
        ADIOS2_FOREACH_PRIMITIVE_STDTYPE_1ARG(declare_template_instantiation)
#undef declare_template_instantiation

        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(adios2::helper::ExceptionToError("adios2_put"));
    }
}